

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

EStatusCodeAndObjectIDTypeList * __thiscall
PDFWriter::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFWriter *this,
          IByteReaderWithPosition *inPDFStream,PDFPageRange *inPageRange,
          EPDFPageBox inPageBoxToUseAsFormBox,double *inTransformationMatrix,
          ObjectIDTypeList *inCopyAdditionalObjects,PDFParsingOptions *inParsingOptions)

{
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_prev =
       local_20._M_impl._M_node.super__List_node_base._M_next;
  PDFHummus::DocumentContext::CreateFormXObjectsFromPDF
            (__return_storage_ptr__,&this->mDocumentContext,inPDFStream,inParsingOptions,inPageRange
             ,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects,
             (ObjectIDTypeList *)local_20._M_impl._M_node.super__List_node_base._M_next);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_20);
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFWriter::CreateFormXObjectsFromPDF(IByteReaderWithPosition* inPDFStream,
																	const PDFPageRange& inPageRange,
																	EPDFPageBox inPageBoxToUseAsFormBox,
																	const double* inTransformationMatrix,
																	const ObjectIDTypeList& inCopyAdditionalObjects,
																	const PDFParsingOptions& inParsingOptions)
{
	return mDocumentContext.CreateFormXObjectsFromPDF(inPDFStream,inParsingOptions,inPageRange,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects);
}